

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O2

AssertionResult __thiscall
(anonymous_namespace)::AnyWriteChecker::operator()(void *this,char *param_1,long *value)

{
  __type_conflict1 _Var1;
  AssertionResult *pAVar2;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> *buf;
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> *buf_00;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  AssertionResult AVar3;
  AssertionResult result;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expected;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> actual;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> writer;
  basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> os;
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  char *local_a20;
  AssertionResult local_a18;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a08;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_9e8;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_> local_9c8;
  string local_9b8 [32];
  AssertionResult local_998 [23];
  basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_> local_820;
  
  local_820.super_basic_buffer<wchar_t>.size_ = 0;
  local_a20 = "char";
  local_820.super_basic_buffer<wchar_t>._vptr_basic_buffer = (_func_int **)&PTR_grow_00264c28;
  local_820.super_basic_buffer<wchar_t>.capacity_ = 500;
  local_9c8.out_.container = &local_820.super_basic_buffer<wchar_t>;
  local_9c8.locale_.locale_ = (void *)0x0;
  local_820.super_basic_buffer<wchar_t>.ptr_ = local_820.store_;
  fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::
  write_decimal<long>((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>
                       *)&local_9c8,*(long *)param_1);
  fmt::v5::to_string<char,500ul>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_9e8,
             (v5 *)&local_820,buf);
  local_a08._M_string_length = 0;
  local_a08.field_2._M_local_buf[0] = local_a08.field_2._M_local_buf[0] & 0xffffff00;
  local_a08._M_dataplus._M_p = (pointer)&local_a08.field_2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_998);
  std::ostream::_M_insert<long>((long)local_998);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a08,local_9b8);
  std::__cxx11::string::~string(local_9b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_998);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_a08,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_9e8);
  if (_Var1) {
    testing::AssertionSuccess();
  }
  else {
    testing::AssertionFailure();
    pAVar2 = testing::AssertionResult::operator<<(local_998,(char (*) [19])"Value of: (Writer<");
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,&local_a20);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [21])">() << value).str()\n");
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x1f8e09);
    pAVar2 = testing::AssertionResult::operator<<
                       (pAVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_9e8);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x1f94d8);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x1f8e15);
    pAVar2 = testing::AssertionResult::operator<<
                       (pAVar2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_a08);
    pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x1f94d8);
    testing::AssertionResult::AssertionResult(&local_a18,pAVar2);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~scoped_ptr(&local_998[0].message_);
  }
  std::__cxx11::string::~string((string *)&local_a08);
  std::__cxx11::string::~string((string *)&local_9e8);
  fmt::v5::basic_memory_buffer<char,_500UL,_std::allocator<char>_>::~basic_memory_buffer
            ((basic_memory_buffer<char,_500UL,_std::allocator<char>_> *)&local_820);
  if (local_a18.success_ == true) {
    local_820.super_basic_buffer<wchar_t>.size_ = 0;
    local_a20 = "wchar_t";
    local_820.super_basic_buffer<wchar_t>._vptr_basic_buffer = (_func_int **)&PTR_grow_00264d50;
    local_820.super_basic_buffer<wchar_t>.capacity_ = 500;
    local_9c8.locale_.locale_ = (void *)0x0;
    local_9c8.out_.container = &local_820.super_basic_buffer<wchar_t>;
    local_820.super_basic_buffer<wchar_t>.ptr_ = local_820.store_;
    fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
    write_decimal<long>(&local_9c8,*(long *)param_1);
    fmt::v5::to_string<wchar_t,500ul>(&local_9e8,(v5 *)&local_820,buf_00);
    local_a08._M_string_length = 0;
    local_a08.field_2._M_local_buf[0] = L'\0';
    local_a08._M_dataplus._M_p = (pointer)&local_a08.field_2;
    std::__cxx11::wostringstream::wostringstream((wostringstream *)local_998);
    std::wostream::_M_insert<long>((long)local_998);
    std::__cxx11::wstringbuf::str();
    std::__cxx11::wstring::operator=((wstring *)&local_a08,(wstring *)local_9b8);
    std::__cxx11::wstring::~wstring((wstring *)local_9b8);
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)local_998);
    _Var1 = std::operator==(&local_a08,&local_9e8);
    if (_Var1) {
      testing::AssertionSuccess();
    }
    else {
      testing::AssertionFailure();
      pAVar2 = testing::AssertionResult::operator<<(local_998,(char (*) [19])"Value of: (Writer<");
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,&local_a20);
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [21])">() << value).str()\n");
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x1f8e09);
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,&local_9e8);
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x1f94d8);
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [11])0x1f8e15);
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,&local_a08);
      pAVar2 = testing::AssertionResult::operator<<(pAVar2,(char (*) [2])0x1f94d8);
      testing::AssertionResult::AssertionResult((AssertionResult *)this,pAVar2);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~scoped_ptr(&local_998[0].message_);
    }
    std::__cxx11::wstring::~wstring((wstring *)&local_a08);
    std::__cxx11::wstring::~wstring((wstring *)&local_9e8);
    fmt::v5::basic_memory_buffer<wchar_t,_500UL,_std::allocator<wchar_t>_>::~basic_memory_buffer
              (&local_820);
  }
  else {
    testing::AssertionResult::AssertionResult((AssertionResult *)this,&local_a18);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&local_a18.message_);
  AVar3.message_.ptr_ = extraout_RDX.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

::testing::AssertionResult operator()(const char *, const T &value) const {
    ::testing::AssertionResult result = check_write<char>(value, "char");
    return result ? check_write<wchar_t>(value, "wchar_t") : result;
  }